

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

void ctemplate_htmlparser::jsparser_buffer_append_chr(jsparser_ctx *js,char chr)

{
  long lVar1;
  char c;
  int iVar2;
  
  iVar2 = js_is_whitespace(chr);
  if (iVar2 != 0) {
    c = jsparser_buffer_get(js,-1);
    iVar2 = js_is_whitespace(c);
    if (iVar2 != 0) {
      return;
    }
  }
  js->buffer[js->buffer_end] = chr;
  lVar1 = (long)(js->buffer_end + 1) % 0x12;
  iVar2 = (int)lVar1;
  js->buffer_end = iVar2;
  if (iVar2 == js->buffer_start) {
    js->buffer_start = (int)((char)((char)lVar1 + '\x01') % '\x12');
  }
  return;
}

Assistant:

void jsparser_buffer_append_chr(jsparser_ctx *js, char chr)
{
  /* Fold whitespace so we have enough space in the buffer. */
  if (js_is_whitespace(chr) &&
      js_is_whitespace(jsparser_buffer_get(js, -1))) {
    return;
  }

  js->buffer[js->buffer_end] = chr;
  js->buffer_end = (js->buffer_end + 1) % JSPARSER_RING_BUFFER_SIZE;
  if (js->buffer_end == js->buffer_start) {
    js->buffer_start = (js->buffer_end + 1) %
        JSPARSER_RING_BUFFER_SIZE;
  }
}